

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

int __thiscall Nes_Dmc::count_reads(Nes_Dmc *this,nes_time_t time,nes_time_t *last_read)

{
  nes_time_t nVar1;
  int *in_RDX;
  int in_ESI;
  Nes_Dmc *in_RDI;
  int count;
  nes_time_t avail;
  nes_time_t first_read;
  int local_2c;
  int local_4;
  
  if (in_RDX != (int *)0x0) {
    *in_RDX = in_ESI;
  }
  if ((in_RDI->super_Nes_Osc).length_counter == 0) {
    local_4 = 0;
  }
  else {
    nVar1 = next_read_time(in_RDI);
    if (in_ESI - nVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_2c = ((in_ESI - nVar1) + -1) / (in_RDI->period << 3) + 1;
      if ((((in_RDI->super_Nes_Osc).regs[0] & 0x40) == 0) &&
         ((in_RDI->super_Nes_Osc).length_counter < local_2c)) {
        local_2c = (in_RDI->super_Nes_Osc).length_counter;
      }
      if (in_RDX != (int *)0x0) {
        *in_RDX = nVar1 + (local_2c + -1) * in_RDI->period * 8 + 1;
      }
      local_4 = local_2c;
    }
  }
  return local_4;
}

Assistant:

int Nes_Dmc::count_reads( nes_time_t time, nes_time_t* last_read ) const
{
	if ( last_read )
		*last_read = time;
	
	if ( length_counter == 0 )
		return 0; // not reading
	
	nes_time_t first_read = next_read_time();
	nes_time_t avail = time - first_read;
	if ( avail <= 0 )
		return 0;
	
	int count = (avail - 1) / (period * 8) + 1;
	if ( !(regs [0] & loop_flag) && count > length_counter )
		count = length_counter;
	
	if ( last_read )
	{
		*last_read = first_read + (count - 1) * (period * 8) + 1;
		check( *last_read <= time );
		check( count == count_reads( *last_read, NULL ) );
		check( count - 1 == count_reads( *last_read - 1, NULL ) );
	}
	
	return count;
}